

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int nh_http_parse(http_context_t *ctx)

{
  char *pcVar1;
  ulong uVar2;
  uint32_t i;
  nh_http_version nVar3;
  uint32_t uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar7 = (ctx->raw).index;
  if ((ctx->raw).length <= uVar7) {
    return 1;
  }
  do {
    switch(ctx->parse_state) {
    case PARSE_METHOD:
      lVar6 = 0;
      do {
        if ((ctx->raw).buf[(ctx->raw).index + (int)lVar6] == ' ') goto LAB_00106057;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      lVar6 = 0xffffffff;
LAB_00106057:
      uVar4 = (uint32_t)lVar6;
      if ((int)uVar4 < 1) {
        return 0;
      }
      (ctx->method).index = uVar7;
      (ctx->method).len = uVar4;
      ctx->parse_state = PARSE_PATH;
      goto LAB_00106134;
    case PARSE_PATH:
      lVar6 = 0;
      do {
        if ((ctx->raw).buf[(ctx->raw).index + (int)lVar6] == ' ') goto LAB_0010611f;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x800);
      lVar6 = 0xffffffff;
LAB_0010611f:
      uVar4 = (uint32_t)lVar6;
      if ((int)uVar4 < 1) {
        return 0;
      }
      (ctx->path).index = uVar7;
      (ctx->path).len = uVar4;
      ctx->parse_state = PARSE_VERSION;
LAB_00106134:
      (ctx->raw).index = uVar4 + uVar7 + 1;
      break;
    case PARSE_VERSION:
      pcVar1 = (ctx->raw).buf;
      if (pcVar1[uVar7] != 'H') {
        return 0;
      }
      uVar2 = 0;
      do {
        uVar9 = uVar2;
        if (uVar9 == 6) break;
        uVar2 = uVar9 + 1;
      } while ("HTTP/1."[uVar9 + 1] == pcVar1[uVar9 + (ulong)uVar7 + 1]);
      if (uVar9 < 6) {
        return 0;
      }
      (ctx->raw).index = uVar7 + 7;
      nVar3 = HTTP_1_0;
      if (pcVar1[uVar7 + 7] != '0') {
        if (pcVar1[uVar7 + 7] != '1') {
          return 0;
        }
        nVar3 = HTTP_1_1;
      }
      ctx->version = nVar3;
      ctx->parse_state = PARSE_LINE_END;
      (ctx->raw).index = uVar7 + 8;
      break;
    case PARSE_HEADER:
      iVar5 = nh_http_parse_consume_header(ctx);
      if (iVar5 == 0) {
        return 0;
      }
      ctx->parse_state = PARSE_LINE_END;
      break;
    case PARSE_SECOND_LINE_END:
      pcVar1 = (ctx->raw).buf;
      if (pcVar1[uVar7] == '\r') {
        lVar6 = 0;
        do {
          lVar8 = lVar6;
          if (lVar8 == 1) break;
          lVar6 = lVar8 + 1;
        } while ("%s: %s\r\n"[lVar8 + 7] == pcVar1[lVar8 + (ulong)uVar7 + 1]);
        if (lVar8 != 0) {
          (ctx->raw).index = uVar7 + 2;
          ctx->parse_state = PARSE_BODY;
          nh_http_parse_get_body_len(ctx);
          goto switchD_00106035_caseD_5;
        }
      }
      ctx->parse_state = PARSE_HEADER;
      break;
    case PARSE_BODY:
switchD_00106035_caseD_5:
      iVar5 = nh_http_parse_consume_body(ctx);
      if (iVar5 != 0) {
        ctx->parse_state = PARSE_DONE;
      }
      break;
    case PARSE_LINE_END:
      pcVar1 = (ctx->raw).buf;
      if (pcVar1[uVar7] != '\r') {
        return 0;
      }
      lVar6 = 0;
      do {
        lVar8 = lVar6;
        if (lVar8 == 1) break;
        lVar6 = lVar8 + 1;
      } while ("%s: %s\r\n"[lVar8 + 7] == pcVar1[lVar8 + (ulong)uVar7 + 1]);
      if (lVar8 == 0) {
        return 0;
      }
      (ctx->raw).index = uVar7 + 2;
      ctx->parse_state = PARSE_SECOND_LINE_END;
      break;
    case PARSE_DONE:
      goto LAB_00106203;
    }
    uVar7 = (ctx->raw).index;
  } while (uVar7 < (ctx->raw).length);
LAB_00106203:
  return 1;
}

Assistant:

int nh_http_parse(http_context_t *ctx) {
    //         Request       = Request-Line
    //                        *(( general-header
    //                         | request-header
    //                         | entity-header ) CRLF)
    //                        CRLF
    //                        [ message-body ]
    //
    // Request-Line   = Method SP Request-URI SP HTTP-Version CRLF
    nh_stream_t *stream = &ctx->raw;
    int offset;
    while (stream->index < stream->length) {
        switch (ctx->parse_state) {
            case PARSE_METHOD:
                if ((offset = nh_stream_find_next(stream, ' ', 16)) <= 0) return 0;
                ctx->method = (nh_anchor_t) {.index = stream->index, .len = offset};
                ctx->parse_state = PARSE_PATH;
                stream->index += offset + 1;
                break;
            case PARSE_PATH:
                if ((offset = nh_stream_find_next(stream, ' ', 2048)) <= 0) return 0;
                ctx->path = (nh_anchor_t) {.index = stream->index, .len = offset};
                ctx->parse_state = PARSE_VERSION;
                stream->index += offset + 1;
                break;
            case PARSE_VERSION:
                if (!nh_string_cmp("HTTP/1.", &stream->buf[stream->index], 7)) return 0;
                stream->index += 7;
                switch (stream->buf[stream->index]) {
                    case '0':
                        ctx->version = HTTP_1_0;
                        break;
                    case '1':
                        ctx->version = HTTP_1_1;
                        break;
                    default:
                        return 0;
                }
                ctx->parse_state = PARSE_LINE_END;
                stream->index += 1;
                break;
            case PARSE_LINE_END:
                if (!nh_string_cmp("\r\n", &stream->buf[stream->index], 2)) return 0;
                stream->index += 2;
                ctx->parse_state = PARSE_SECOND_LINE_END;
                break;
            case PARSE_SECOND_LINE_END:
                if (!nh_string_cmp("\r\n", &stream->buf[stream->index], 2)) {
                    ctx->parse_state = PARSE_HEADER;
                    break;
                }
                // parse body
                stream->index += 2;
                ctx->parse_state = PARSE_BODY;
                // get body length before consume body
                nh_http_parse_get_body_len(ctx);
                // fallthrough
            case PARSE_BODY:
                if (nh_http_parse_consume_body(ctx)) ctx->parse_state = PARSE_DONE;
                break;
            case PARSE_HEADER:
                if (!nh_http_parse_consume_header(ctx)) return 0;
                ctx->parse_state = PARSE_LINE_END;
                break;
            case PARSE_DONE:
                return 1;
        }
    }
    return 1;
}